

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

int Ivy_FraigCheckOutputSims(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  Ivy_Obj_t *pObj;
  long lVar3;
  ulong uVar4;
  
  pVVar1 = p->pManAig->vPos;
  lVar2 = (long)pVVar1->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if (0 < p->nSimWords) {
        pObj = (Ivy_Obj_t *)(*(ulong *)((long)pVVar1->pArray[lVar3] + 0x10) & 0xfffffffffffffffe);
        uVar4 = 0;
        do {
          if (*(int *)((long)&pObj->pFanout->pFanout + uVar4 * 4) != 0) {
            Ivy_FraigCheckOutputSimsSavePattern(p,pObj);
            return 1;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)p->nSimWords != uVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar2);
  }
  return 0;
}

Assistant:

int Ivy_FraigCheckOutputSims( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
//    pObj = Ivy_ManPo( p->pManAig, 0 );
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        //assert( Ivy_ObjFanin0(pObj)->fPhase == (unsigned)Ivy_ObjFaninC0(pObj) ); // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) == 0
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) ) // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj))
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
        // check 
        if ( !Ivy_NodeHasZeroSim( p, Ivy_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Ivy_FraigCheckOutputSimsSavePattern( p, Ivy_ObjFanin0(pObj) );
            return 1;
        }
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) )
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
    }
    return 0;
}